

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emit_dfa.cc
# Opt level: O0

void __thiscall
re2c::DFA::emit(DFA *this,Output *output,uint32_t *ind,bool isLastCond,bool *bPrologBrace)

{
  uint32_t uVar1;
  BitMap *pBVar2;
  bool bVar3;
  opt_t *poVar4;
  OutputFile *pOVar5;
  size_type sVar6;
  ulong uVar7;
  long lVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar9;
  uint32_t local_30c;
  uint32_t local_21c;
  byte local_119;
  string local_110 [32];
  string local_f0;
  uint32_t local_cc;
  uint32_t local_c8;
  uint32_t local_c4;
  _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Stack_c0;
  uint32_t i;
  undefined1 local_b8;
  _Base_ptr local_b0;
  undefined1 local_a8;
  uint32_t local_a0;
  label_t local_90;
  label_t local_8c;
  undefined1 local_88 [8];
  set<re2c::label_t,_std::less<re2c::label_t>,_std::allocator<re2c::label_t>_> used_labels;
  State *local_50;
  State *s;
  key_type local_40;
  label_t initial_label;
  label_t start_label;
  bool bProlog;
  OutputFile *o;
  bool *bPrologBrace_local;
  bool isLastCond_local;
  uint32_t *ind_local;
  Output *output_local;
  DFA *this_local;
  
  poVar4 = Opt::operator->((Opt *)&opts);
  local_119 = 1;
  if ((poVar4->cFlag & 1U) != 0) {
    local_119 = bWroteCondCheck ^ 0xff;
  }
  initial_label.value._3_1_ = local_119 & 1;
  local_40.value = (uint32_t)counter_t<re2c::label_t>::next(&(output->source).label_counter);
  if (((initial_label.value._3_1_ & 1) == 0) ||
     (poVar4 = Opt::operator->((Opt *)&opts), (poVar4->cFlag & 1U) == 0)) {
    s._4_4_ = local_40.value;
  }
  else {
    s._4_4_ = counter_t<re2c::label_t>::next(&(output->source).label_counter);
  }
  for (local_50 = this->head; local_50 != (State *)0x0; local_50 = local_50->next) {
    used_labels._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ =
         counter_t<re2c::label_t>::next(&(output->source).label_counter);
    (local_50->label).value = used_labels._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_;
  }
  std::set<re2c::label_t,_std::less<re2c::label_t>,_std::allocator<re2c::label_t>_>::set
            ((set<re2c::label_t,_std::less<re2c::label_t>,_std::allocator<re2c::label_t>_> *)
             local_88);
  local_8c.value = local_40.value;
  local_90.value = s._4_4_;
  bVar3 = OutputFile::get_force_start_label(&output->source);
  value = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(ulong)bVar3;
  count_used_labels(this,(set<re2c::label_t,_std::less<re2c::label_t>,_std::allocator<re2c::label_t>_>
                          *)local_88,local_8c,local_90,bVar3);
  local_a0 = s._4_4_;
  Action::set_initial(&this->head->action,s._4_4_,(this->head->action).type == SAVE);
  Skeleton::warn_undefined_control_flow(this->skeleton);
  Skeleton::warn_unreachable_rules(this->skeleton);
  Skeleton::warn_match_empty(this->skeleton);
  poVar4 = Opt::operator->((Opt *)&opts);
  if (poVar4->target == SKELETON) {
    pVar9 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert(&output->skeletons,&this->name);
    _Stack_c0 = pVar9.first._M_node;
    local_b8 = pVar9.second;
    local_b0 = _Stack_c0._M_node;
    local_a8 = local_b8;
    if (((undefined1  [16])pVar9 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      Skeleton::emit_data(this->skeleton,(output->source).file_name);
      Skeleton::emit_start
                (this->skeleton,&output->source,this->max_fill,(bool)(this->need_backup & 1),
                 (bool)(this->need_backupctx & 1),(bool)(this->need_accept & 1));
      local_c4 = 2;
      local_c8 = s._4_4_;
      emit_body(this,&output->source,&local_c4,
                (set<re2c::label_t,_std::less<re2c::label_t>,_std::allocator<re2c::label_t>_> *)
                local_88,s._4_4_);
      Skeleton::emit_end(this->skeleton,&output->source,(bool)(this->need_backup & 1),
                         (bool)(this->need_backupctx & 1));
    }
  }
  else {
    if ((initial_label.value._3_1_ & 1) != 0) {
      pOVar5 = OutputFile::ws(&output->source,"\n");
      OutputFile::wdelay_line_info(pOVar5);
      poVar4 = Opt::operator->((Opt *)&opts);
      if (poVar4->target == DOT) {
        *bPrologBrace = true;
        OutputFile::ws(&output->source,"digraph re2c {\n");
      }
      else {
        poVar4 = Opt::operator->((Opt *)&opts);
        if (((((((poVar4->fFlag & 1U) == 0) &&
               (bVar3 = OutputFile::get_used_yyaccept(&output->source), bVar3)) ||
              ((poVar4 = Opt::operator->((Opt *)&opts), (poVar4->fFlag & 1U) == 0 &&
               (poVar4 = Opt::operator->((Opt *)&opts), (poVar4->bEmitYYCh & 1U) != 0)))) ||
             (((poVar4 = Opt::operator->((Opt *)&opts), (poVar4->bFlag & 1U) != 0 &&
               (poVar4 = Opt::operator->((Opt *)&opts), (poVar4->cFlag & 1U) == 0)) &&
              (BitMap::first != (BitMap *)0x0)))) ||
            (((poVar4 = Opt::operator->((Opt *)&opts), (poVar4->cFlag & 1U) != 0 &&
              ((bWroteCondCheck & 1) == 0)) &&
             (poVar4 = Opt::operator->((Opt *)&opts), (poVar4->gFlag & 1U) != 0)))) ||
           (((poVar4 = Opt::operator->((Opt *)&opts), (poVar4->fFlag & 1U) != 0 &&
             ((bWroteGetState & 1) == 0)) &&
            (poVar4 = Opt::operator->((Opt *)&opts), (poVar4->gFlag & 1U) != 0)))) {
          *bPrologBrace = true;
          uVar1 = *ind;
          *ind = uVar1 + 1;
          pOVar5 = OutputFile::wind(&output->source,uVar1);
          OutputFile::ws(pOVar5,"{\n");
        }
        else if (*ind == 0) {
          *ind = 1;
        }
      }
      poVar4 = Opt::operator->((Opt *)&opts);
      if (((poVar4->fFlag & 1U) == 0) &&
         (poVar4 = Opt::operator->((Opt *)&opts), poVar4->target != DOT)) {
        poVar4 = Opt::operator->((Opt *)&opts);
        if ((poVar4->bEmitYYCh & 1U) != 0) {
          pOVar5 = OutputFile::wind(&output->source,*ind);
          poVar4 = Opt::operator->((Opt *)&opts);
          pOVar5 = OutputFile::wstring(pOVar5,&poVar4->yyctype);
          pOVar5 = OutputFile::ws(pOVar5," ");
          poVar4 = Opt::operator->((Opt *)&opts);
          pOVar5 = OutputFile::wstring(pOVar5,&poVar4->yych);
          OutputFile::ws(pOVar5,";\n");
        }
        OutputFile::wdelay_yyaccept_init(&output->source,*ind);
      }
      else {
        OutputFile::ws(&output->source,"\n");
      }
    }
    poVar4 = Opt::operator->((Opt *)&opts);
    if ((((poVar4->bFlag & 1U) != 0) &&
        (poVar4 = Opt::operator->((Opt *)&opts), (poVar4->cFlag & 1U) == 0)) &&
       (BitMap::first != (BitMap *)0x0)) {
      if (this->ubChar < 0x101) {
        local_21c = this->ubChar;
      }
      else {
        local_21c = 0x100;
      }
      BitMap::gen(&output->source,*ind,this->lbChar,local_21c);
    }
    if ((initial_label.value._3_1_ & 1) != 0) {
      poVar4 = Opt::operator->((Opt *)&opts);
      if ((((poVar4->cFlag & 1U) != 0) && ((bWroteCondCheck & 1) == 0)) &&
         (poVar4 = Opt::operator->((Opt *)&opts), (poVar4->gFlag & 1U) != 0)) {
        genCondTable(&output->source,*ind,&output->types);
      }
      OutputFile::wdelay_state_goto(&output->source,*ind);
      poVar4 = Opt::operator->((Opt *)&opts);
      if ((((poVar4->cFlag & 1U) != 0) &&
          (poVar4 = Opt::operator->((Opt *)&opts), poVar4->target != DOT)) &&
         (sVar6 = std::set<re2c::label_t,_std::less<re2c::label_t>,_std::allocator<re2c::label_t>_>
                  ::count((set<re2c::label_t,_std::less<re2c::label_t>,_std::allocator<re2c::label_t>_>
                           *)local_88,&local_40), sVar6 != 0)) {
        poVar4 = Opt::operator->((Opt *)&opts);
        pOVar5 = OutputFile::wstring(&output->source,&poVar4->labelPrefix);
        local_cc = local_40.value;
        pOVar5 = OutputFile::wlabel(pOVar5,(label_t)local_40.value);
        OutputFile::ws(pOVar5,":\n");
      }
      OutputFile::wuser_start_label(&output->source);
      poVar4 = Opt::operator->((Opt *)&opts);
      if (((poVar4->cFlag & 1U) != 0) && ((bWroteCondCheck & 1) == 0)) {
        genCondGoto(&output->source,*ind,&output->types);
      }
    }
    poVar4 = Opt::operator->((Opt *)&opts);
    if (((poVar4->cFlag & 1U) != 0) && (uVar7 = std::__cxx11::string::empty(), (uVar7 & 1) == 0)) {
      Opt::operator->((Opt *)&opts);
      lVar8 = std::__cxx11::string::length();
      if (lVar8 != 0) {
        poVar4 = Opt::operator->((Opt *)&opts);
        std::__cxx11::string::string(local_110,(string *)&poVar4->condDivider);
        poVar4 = Opt::operator->((Opt *)&opts);
        replaceParam<std::__cxx11::string>
                  (&local_f0,(re2c *)local_110,&poVar4->condDividerParam,&this->cond,value);
        pOVar5 = OutputFile::wstring(&output->source,&local_f0);
        OutputFile::ws(pOVar5,"\n");
        std::__cxx11::string::~string((string *)&local_f0);
        std::__cxx11::string::~string(local_110);
      }
      poVar4 = Opt::operator->((Opt *)&opts);
      if (poVar4->target == DOT) {
        pOVar5 = OutputFile::wstring(&output->source,&this->cond);
        pOVar5 = OutputFile::ws(pOVar5," -> ");
        pOVar5 = OutputFile::wlabel(pOVar5,(label_t)(this->head->label).value);
        OutputFile::ws(pOVar5,"\n");
      }
      else {
        poVar4 = Opt::operator->((Opt *)&opts);
        pOVar5 = OutputFile::wstring(&output->source,&poVar4->condPrefix);
        pOVar5 = OutputFile::wstring(pOVar5,&this->cond);
        OutputFile::ws(pOVar5,":\n");
      }
    }
    poVar4 = Opt::operator->((Opt *)&opts);
    if ((((poVar4->cFlag & 1U) != 0) &&
        (poVar4 = Opt::operator->((Opt *)&opts), (poVar4->bFlag & 1U) != 0)) &&
       (BitMap::first != (BitMap *)0x0)) {
      uVar1 = *ind;
      *ind = uVar1 + 1;
      pOVar5 = OutputFile::wind(&output->source,uVar1);
      OutputFile::ws(pOVar5,"{\n");
      if (this->ubChar < 0x101) {
        local_30c = this->ubChar;
      }
      else {
        local_30c = 0x100;
      }
      BitMap::gen(&output->source,*ind,this->lbChar,local_30c);
    }
    emit_body(this,&output->source,ind,
              (set<re2c::label_t,_std::less<re2c::label_t>,_std::allocator<re2c::label_t>_> *)
              local_88,s._4_4_);
    poVar4 = Opt::operator->((Opt *)&opts);
    if ((((poVar4->cFlag & 1U) != 0) &&
        (poVar4 = Opt::operator->((Opt *)&opts), (poVar4->bFlag & 1U) != 0)) &&
       (BitMap::first != (BitMap *)0x0)) {
      uVar1 = *ind;
      *ind = uVar1 - 1;
      pOVar5 = OutputFile::wind(&output->source,uVar1 - 1);
      OutputFile::ws(pOVar5,"}\n");
    }
    poVar4 = Opt::operator->((Opt *)&opts);
    if ((((poVar4->cFlag & 1U) == 0) || (isLastCond)) && ((*bPrologBrace & 1U) != 0)) {
      uVar1 = *ind;
      *ind = uVar1 - 1;
      pOVar5 = OutputFile::wind(&output->source,uVar1 - 1);
      OutputFile::ws(pOVar5,"}\n");
    }
  }
  pBVar2 = BitMap::first;
  if (BitMap::first != (BitMap *)0x0) {
    if (BitMap::first != (BitMap *)0x0) {
      BitMap::~BitMap(BitMap::first);
      operator_delete(pBVar2,0x20);
    }
    BitMap::first = (BitMap *)0x0;
  }
  std::set<re2c::label_t,_std::less<re2c::label_t>,_std::allocator<re2c::label_t>_>::~set
            ((set<re2c::label_t,_std::less<re2c::label_t>,_std::allocator<re2c::label_t>_> *)
             local_88);
  return;
}

Assistant:

void DFA::emit(Output & output, uint32_t& ind, bool isLastCond, bool& bPrologBrace)
{
	OutputFile & o = output.source;

	bool bProlog = (!opts->cFlag || !bWroteCondCheck);

	// start_label points to the beginning of current re2c block
	// (prior to condition dispatch in '-c' mode)
	// it can forced by configuration 're2c:startlabel = <integer>;'
	label_t start_label = o.label_counter.next ();
	// initial_label points to the beginning of DFA
	// in '-c' mode this is NOT equal to start_label
	label_t initial_label = bProlog && opts->cFlag
		? o.label_counter.next ()
		: start_label;
	for (State * s = head; s; s = s->next)
	{
		s->label = o.label_counter.next ();
	}
	std::set<label_t> used_labels;
	count_used_labels (used_labels, start_label, initial_label, o.get_force_start_label ());

	head->action.set_initial (initial_label, head->action.type == Action::SAVE);

	skeleton->warn_undefined_control_flow ();
	skeleton->warn_unreachable_rules ();
	skeleton->warn_match_empty ();

	if (opts->target == opt_t::SKELETON)
	{
		if (output.skeletons.insert (name).second)
		{
			skeleton->emit_data (o.file_name);
			skeleton->emit_start (o, max_fill, need_backup, need_backupctx, need_accept);
			uint32_t i = 2;
			emit_body (o, i, used_labels, initial_label);
			skeleton->emit_end (o, need_backup, need_backupctx);
		}
	}
	else
	{
		// Generate prolog
		if (bProlog)
		{
			o.ws("\n").wdelay_line_info ();
			if (opts->target == opt_t::DOT)
			{
				bPrologBrace = true;
				o.ws("digraph re2c {\n");
			}
			else if ((!opts->fFlag && o.get_used_yyaccept ())
			||  (!opts->fFlag && opts->bEmitYYCh)
			||  (opts->bFlag && !opts->cFlag && BitMap::first)
			||  (opts->cFlag && !bWroteCondCheck && opts->gFlag)
			||  (opts->fFlag && !bWroteGetState && opts->gFlag)
			)
			{
				bPrologBrace = true;
				o.wind(ind++).ws("{\n");
			}
			else if (ind == 0)
			{
				ind = 1;
			}
			if (!opts->fFlag && opts->target != opt_t::DOT)
			{
				if (opts->bEmitYYCh)
				{
					o.wind(ind).wstring(opts->yyctype).ws(" ").wstring(opts->yych).ws(";\n");
				}
				o.wdelay_yyaccept_init (ind);
			}
			else
			{
				o.ws("\n");
			}
		}
		if (opts->bFlag && !opts->cFlag && BitMap::first)
		{
			BitMap::gen(o, ind, lbChar, ubChar <= 256 ? ubChar : 256);
		}
		if (bProlog)
		{
			if (opts->cFlag && !bWroteCondCheck && opts->gFlag)
			{
				genCondTable(o, ind, output.types);
			}
			o.wdelay_state_goto (ind);
			if (opts->cFlag && opts->target != opt_t::DOT)
			{
				if (used_labels.count(start_label))
				{
					o.wstring(opts->labelPrefix).wlabel(start_label).ws(":\n");
				}
			}
			o.wuser_start_label ();
			if (opts->cFlag && !bWroteCondCheck)
			{
				genCondGoto(o, ind, output.types);
			}
		}
		if (opts->cFlag && !cond.empty())
		{
			if (opts->condDivider.length())
			{
				o.wstring(replaceParam(opts->condDivider, opts->condDividerParam, cond)).ws("\n");
			}
			if (opts->target == opt_t::DOT)
			{
				o.wstring(cond).ws(" -> ").wlabel(head->label).ws("\n");
			}
			else
			{
				o.wstring(opts->condPrefix).wstring(cond).ws(":\n");
			}
		}
		if (opts->cFlag && opts->bFlag && BitMap::first)
		{
			o.wind(ind++).ws("{\n");
			BitMap::gen(o, ind, lbChar, ubChar <= 256 ? ubChar : 256);
		}
		// Generate code
		emit_body (o, ind, used_labels, initial_label);
		if (opts->cFlag && opts->bFlag && BitMap::first)
		{
			o.wind(--ind).ws("}\n");
		}
		// Generate epilog
		if ((!opts->cFlag || isLastCond) && bPrologBrace)
		{
			o.wind(--ind).ws("}\n");
		}
	}

	// Cleanup
	if (BitMap::first)
	{
		delete BitMap::first;
		BitMap::first = NULL;
	}
}